

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert-llama2c-to-ggml.cpp
# Opt level: O3

string * __thiscall
my_llama_file::read_string_abi_cxx11_
          (string *__return_storage_ptr__,my_llama_file *this,uint32_t len)

{
  ulong __n;
  vector<char,_std::allocator<char>_> chars;
  allocator_type local_39;
  vector<char,_std::allocator<char>_> local_38;
  
  __n = (ulong)len;
  std::vector<char,_std::allocator<char>_>::vector(&local_38,__n,&local_39);
  read_raw(this,local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,__n);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + __n);
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string read_string(std::uint32_t len) {
        std::vector<char> chars(len);
        read_raw(chars.data(), len);
        return std::string(chars.data(), len);
    }